

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# forces_and_moments.cpp
# Opt level: O3

double __thiscall InitShift::calculate(InitShift *this,double x,int degree)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  double dVar7;
  uint uVar8;
  double dVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  uint uVar17;
  uint uVar18;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  uint uVar19;
  uint uVar20;
  
  uVar1 = -degree;
  if (0 < degree) {
    return 0.0;
  }
  dVar7 = this->force;
  if (degree != 0) {
    uVar3 = 1 - degree;
    dVar9 = 1.0;
    do {
      dVar9 = dVar9 * x;
      uVar3 = uVar3 - 1;
    } while (1 < uVar3);
    dVar7 = dVar7 * dVar9;
    if (degree < -1) {
      uVar3 = 2;
      if (uVar1 < 2) {
        uVar3 = uVar1;
      }
      uVar6 = -(uVar3 + degree);
      auVar15._4_4_ = uVar1 - 1;
      auVar15._0_4_ = uVar1;
      auVar15._8_4_ = uVar1 - 2;
      auVar15._12_4_ = uVar1 - 3;
      iVar4 = 4;
      uVar1 = 1;
      uVar19 = 1;
      uVar12 = 1;
      uVar20 = 1;
      do {
        uVar13 = uVar20;
        uVar11 = uVar12;
        uVar10 = uVar19;
        uVar8 = uVar1;
        uVar1 = auVar15._0_4_ * uVar8;
        uVar12 = (uint)((auVar15._8_8_ & 0xffffffff) * (ulong)uVar11);
        uVar19 = auVar15._4_4_ * uVar10;
        uVar20 = auVar15._12_4_ * uVar13;
        auVar16._0_4_ = auVar15._0_4_ + -4;
        auVar16._4_4_ = auVar15._4_4_ + -4;
        auVar16._8_4_ = auVar15._8_4_ + -4;
        auVar16._12_4_ = auVar15._12_4_ + -4;
        iVar5 = iVar4 + -4;
        iVar2 = iVar4 + (4 - (uVar3 + degree) & 0xfffffffc);
        auVar15 = auVar16;
        iVar4 = iVar5;
      } while (iVar2 != 8);
      uVar3 = -iVar5;
      uVar14 = -(uint)((int)(uVar6 ^ 0x80000000) < (int)(uVar3 ^ 0x80000000));
      uVar17 = -(uint)((int)(uVar6 ^ 0x80000000) < (int)((uVar3 | 1) ^ 0x80000000));
      uVar18 = -(uint)((int)(uVar6 ^ 0x80000000) < (int)((uVar3 | 2) ^ 0x80000000));
      uVar3 = -(uint)((int)(uVar6 ^ 0x80000000) < (int)((uVar3 | 3) ^ 0x80000000));
      dVar9 = (double)(int)((~uVar18 & uVar12 | uVar11 & uVar18) *
                            (~uVar14 & uVar1 | uVar8 & uVar14) *
                           (~uVar17 & uVar19 | uVar10 & uVar17) * (~uVar3 & uVar20 | uVar13 & uVar3)
                           );
      goto LAB_00106432;
    }
  }
  dVar9 = 1.0;
LAB_00106432:
  return dVar7 / dVar9;
}

Assistant:

double InitShift::calculate(double x, int degree) const
{
    // Added IJ as a force for easier counting
    return calculatePolinomAtPoint(x, force, -degree);
}